

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

void read_metadata_timecode(aom_read_bit_buffer *rb)

{
  int iVar1;
  int time_offset_length;
  int hours_flag;
  int minutes_flag;
  int seconds_flag;
  int full_timestamp_flag;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  aom_rb_read_literal((aom_read_bit_buffer *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
  iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  aom_rb_read_bit((aom_read_bit_buffer *)
                  CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  aom_rb_read_bit((aom_read_bit_buffer *)
                  CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  aom_rb_read_literal((aom_read_bit_buffer *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
  if (iVar1 == 0) {
    iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)
                            CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (iVar1 != 0) {
      aom_rb_read_literal((aom_read_bit_buffer *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffdc);
      iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      if (iVar1 != 0) {
        aom_rb_read_literal((aom_read_bit_buffer *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffdc);
        iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
        if (iVar1 != 0) {
          aom_rb_read_literal((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                              in_stack_ffffffffffffffdc);
        }
      }
    }
  }
  else {
    aom_rb_read_literal((aom_read_bit_buffer *)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
    aom_rb_read_literal((aom_read_bit_buffer *)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
    aom_rb_read_literal((aom_read_bit_buffer *)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
  }
  iVar1 = aom_rb_read_literal((aom_read_bit_buffer *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                              in_stack_ffffffffffffffdc);
  if (iVar1 != 0) {
    aom_rb_read_literal((aom_read_bit_buffer *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

static void read_metadata_timecode(struct aom_read_bit_buffer *rb) {
  aom_rb_read_literal(rb, 5);  // counting_type f(5)
  const int full_timestamp_flag =
      aom_rb_read_bit(rb);     // full_timestamp_flag f(1)
  aom_rb_read_bit(rb);         // discontinuity_flag (f1)
  aom_rb_read_bit(rb);         // cnt_dropped_flag f(1)
  aom_rb_read_literal(rb, 9);  // n_frames f(9)
  if (full_timestamp_flag) {
    aom_rb_read_literal(rb, 6);  // seconds_value f(6)
    aom_rb_read_literal(rb, 6);  // minutes_value f(6)
    aom_rb_read_literal(rb, 5);  // hours_value f(5)
  } else {
    const int seconds_flag = aom_rb_read_bit(rb);  // seconds_flag f(1)
    if (seconds_flag) {
      aom_rb_read_literal(rb, 6);                    // seconds_value f(6)
      const int minutes_flag = aom_rb_read_bit(rb);  // minutes_flag f(1)
      if (minutes_flag) {
        aom_rb_read_literal(rb, 6);                  // minutes_value f(6)
        const int hours_flag = aom_rb_read_bit(rb);  // hours_flag f(1)
        if (hours_flag) {
          aom_rb_read_literal(rb, 5);  // hours_value f(5)
        }
      }
    }
  }
  // time_offset_length f(5)
  const int time_offset_length = aom_rb_read_literal(rb, 5);
  if (time_offset_length) {
    // time_offset_value f(time_offset_length)
    aom_rb_read_literal(rb, time_offset_length);
  }
}